

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npp.cpp
# Opt level: O2

void __thiscall pg::NPPSolver::NPPSolver(NPPSolver *this,Oink *oink,Game *game)

{
  uint uVar1;
  Game *pGVar2;
  int *piVar3;
  uint *puVar4;
  uint uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  
  Solver::Solver(&this->super_Solver,oink,game);
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__NPPSolver_0019d5c8;
  this->maxpromos = 0;
  this->queries = 0;
  this->promos = 0;
  this->doms = 0;
  this->totqueries = 0;
  this->totpromos = 0;
  this->maxqueries = 0;
  this->maxpromos = 0;
  pGVar2 = (this->super_Solver).game;
  uVar1 = *(uint *)((long)pGVar2->_priority + ((pGVar2->n_vertices << 0x20) + -0x100000000 >> 0x1e))
  ;
  this->maxprio = uVar1;
  this->strategy = game->strategy;
  piVar3 = (int *)operator_new__((ulong)(uVar1 + 1) << 2);
  auVar7 = ZEXT816(0) << 0x40;
  this->inverse = piVar3;
  (this->Phase).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->Phase).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_offset = 0;
  (this->Phase).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->Phase).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  this->D = (bitset)ZEXT1632(auVar7);
  (this->E).pointer = 0;
  (this->E).queue = (uint *)0x0;
  (this->outgame)._bits = (uint64_t *)0x0;
  (this->outgame)._size = 0;
  (this->outgame)._bitssize = 0;
  (this->outgame)._allocsize = 0;
  (this->winzero)._bits = (uint64_t *)0x0;
  (this->winzero)._size = 0;
  (this->winzero)._bitssize = 0;
  (this->winzero)._allocsize = 0;
  *(undefined8 *)((long)&(this->outgame)._size + 4) = 0;
  *(undefined8 *)((long)&(this->outgame)._bitssize + 4) = 0;
  *(undefined8 *)((long)&(this->outgame)._allocsize + 4) = 0;
  *(undefined8 *)((long)&(this->winzero)._bits + 4) = 0;
  *(undefined8 *)((long)&(this->winzero)._size + 4) = 0;
  *(undefined8 *)((long)&(this->winzero)._bitssize + 4) = 0;
  *(undefined8 *)((long)&(this->winzero)._allocsize + 4) = 0;
  this->End = 0;
  this->Pivot = 0;
  (this->Phase).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->Supgame).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Supgame).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Supgame).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Heads).
  super__Vector_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Heads).
  super__Vector_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Heads).
  super__Vector_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Exits).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Exits).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Exits).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Entries).
  super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Entries).
  super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Entries).
  super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->R)._bits = (uint64_t *)0x0;
  (this->R)._size = 0;
  (this->R)._bitssize = 0;
  uVar5 = 500;
  if (9999 < uVar1) {
    uVar5 = uVar1 / 0x14;
  }
  (this->R)._allocsize = 0;
  this->O = (bitset)ZEXT1632(auVar7);
  *(undefined1 (*) [32])((long)&(this->O)._size + 4) = ZEXT1632(auVar7);
  bitset::resize(&this->outgame,pGVar2->n_vertices);
  bitset::resize(&this->winzero,((this->super_Solver).game)->n_vertices);
  uVar6 = (ulong)uVar5;
  std::vector<bool,_std::allocator<bool>_>::reserve(&this->Phase,uVar6);
  std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::reserve(&this->Supgame,uVar6);
  std::
  vector<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::reserve(&this->Heads,uVar6);
  std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::reserve(&this->Exits,uVar6);
  std::
  vector<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
  ::reserve(&this->Entries,uVar6);
  bitset::resize(&this->R,((this->super_Solver).game)->n_vertices);
  puVar4 = (this->T).queue;
  uVar6 = ((this->super_Solver).game)->n_vertices;
  (this->T).pointer = 0;
  if (puVar4 != (uint *)0x0) {
    operator_delete__(puVar4);
  }
  puVar4 = (uint *)operator_new__((uVar6 & 0xffffffff) << 2);
  (this->T).queue = puVar4;
  puVar4 = (this->E).queue;
  uVar6 = ((this->super_Solver).game)->n_vertices;
  (this->E).pointer = 0;
  if (puVar4 != (uint *)0x0) {
    operator_delete__(puVar4);
  }
  puVar4 = (uint *)operator_new__((uVar6 & 0xffffffff) << 2);
  (this->E).queue = puVar4;
  return;
}

Assistant:

NPPSolver::NPPSolver(Oink& oink, Game& game) :
    Solver(oink, game),
    totqueries(0), totpromos(0), maxqueries(0), maxpromos(0), queries(0), promos(0), doms(0),
    maxprio(priority(nodecount() - 1)), strategy(game.getStrategy()), inverse(new int[maxprio + 1]),
    Top(0), End(0), Pivot(0)
{
    // TODO: rewrite to no longer copy the current game.strategy
    uint resprio = maxprio / 20;
    resprio = (resprio >= 500) ? resprio : 500;
    outgame.resize(nodecount());
    winzero.resize(nodecount());
    Phase.reserve(resprio);
    Supgame.reserve(resprio);
    Heads.reserve(resprio);
    Exits.reserve(resprio);
    Entries.reserve(resprio);
    R.resize(nodecount());
    T.resize(nodecount());
    E.resize(nodecount());
}